

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O3

QAccessibleInterface * __thiscall QAccessibleTree::child(QAccessibleTree *this,int logicalIndex)

{
  ChildCache *this_00;
  Span *pSVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  QAbstractItemView *this_01;
  QAbstractItemModel *pQVar5;
  QAccessibleTableCell *this_02;
  QHeaderView *pQVar6;
  undefined8 uVar7;
  Role RVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  const_iterator cVar10;
  int copy;
  uint local_7c;
  undefined1 *local_78;
  undefined1 *puStack_70;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_68;
  undefined1 *local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = logicalIndex;
  (**(code **)(*(long *)&(this->super_QAccessibleTable).super_QAccessibleObject + 0x18))
            (&(this->super_QAccessibleTable).super_QAccessibleObject);
  this_01 = (QAbstractItemView *)QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
  if (this_01 != (QAbstractItemView *)0x0) {
    pQVar5 = QAbstractItemView::model(this_01);
    local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    QAbstractItemView::rootIndex((QModelIndex *)&local_58,this_01);
    if ((pQVar5 != (QAbstractItemModel *)0x0 && -1 < logicalIndex) &&
       (iVar2 = (**(code **)(*(long *)pQVar5 + 0x80))(pQVar5,&local_58), iVar2 != 0)) {
      this_00 = &(this->super_QAccessibleTable).childToId;
      cVar10 = QHash<int,_unsigned_int>::constFindImpl<int>(this_00,&local_3c);
      iVar2 = local_3c;
      if (cVar10.i.d != (Data<QHashPrivate::Node<int,_unsigned_int>_> *)0x0 || cVar10.i.bucket != 0)
      {
        pSVar1 = (cVar10.i.d)->spans;
        uVar9 = cVar10.i.bucket >> 7;
        this_02 = (QAccessibleTableCell *)
                  QAccessible::accessibleInterface
                            (*(uint *)(pSVar1[uVar9].entries
                                       [pSVar1[uVar9].offsets[(uint)cVar10.i.bucket & 0x7f]].storage
                                       .data + 4));
        goto LAB_0052a31d;
      }
      pQVar6 = QAccessibleTable::horizontalHeader(&this->super_QAccessibleTable);
      if (pQVar6 == (QHeaderView *)0x0) {
LAB_0052a27e:
        iVar3 = (**(code **)(*(long *)pQVar5 + 0x80))(pQVar5,&local_58);
        iVar4 = (**(code **)(*(long *)pQVar5 + 0x80))
                          (pQVar5,&local_58,(long)iVar2 % (long)iVar3 & 0xffffffff);
        local_68.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_78 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
        indexFromLogical((QModelIndex *)&local_78,this,iVar2 / iVar3,iVar2 % iVar4);
        if ((((int)local_78 < 0) || ((long)local_78 < 0)) ||
           (local_68.ptr == (QAbstractItemModel *)0x0)) goto LAB_0052a31a;
        this_02 = (QAccessibleTableCell *)operator_new(0x38);
        RVar8 = (this->super_QAccessibleTable).m_role;
        if (RVar8 == Tree) {
          RVar8 = TreeItem;
        }
        else if (RVar8 == List) {
          RVar8 = ListItem;
        }
        else if (RVar8 == Table) {
          RVar8 = Cell;
        }
        else {
          RVar8 = NoRole;
        }
        QAccessibleTableCell::QAccessibleTableCell
                  (this_02,(QAbstractItemView *)this_01,(QModelIndex *)&local_78,RVar8);
      }
      else {
        iVar3 = (**(code **)(*(long *)pQVar5 + 0x80))(pQVar5,&local_58);
        if (iVar3 <= iVar2) {
          iVar3 = (**(code **)(*(long *)pQVar5 + 0x80))(pQVar5,&local_58);
          iVar2 = iVar2 - iVar3;
          goto LAB_0052a27e;
        }
        this_02 = (QAccessibleTableCell *)operator_new(0x20);
        *(undefined ***)this_02 = &PTR__QAccessibleTableHeaderCell_0080a690;
        uVar7 = QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)this_01);
        *(undefined8 *)&this_02->super_QAccessibleTableCellInterface = uVar7;
        *(QAbstractItemView **)&this_02->super_QAccessibleActionInterface = this_01;
        *(int *)&(this_02->view).wp.d = iVar2;
        *(undefined4 *)((long)&(this_02->view).wp.d + 4) = 1;
      }
      QAccessible::registerAccessibleInterface(&this_02->super_QAccessibleInterface);
      local_7c = QAccessible::uniqueId(&this_02->super_QAccessibleInterface);
      local_78 = (undefined1 *)CONCAT44(local_78._4_4_,local_3c);
      QHash<int,unsigned_int>::emplace<unsigned_int_const&>
                ((QHash<int,unsigned_int> *)this_00,(int *)&local_78,&local_7c);
      goto LAB_0052a31d;
    }
  }
LAB_0052a31a:
  this_02 = (QAccessibleTableCell *)0x0;
LAB_0052a31d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return &this_02->super_QAccessibleInterface;
}

Assistant:

QAccessibleInterface *QAccessibleTree::child(int logicalIndex) const
{
    QAbstractItemView *theView = view();
    if (!theView)
        return nullptr;
    const QAbstractItemModel *theModel = theView->model();
    const QModelIndex rootIndex = theView->rootIndex();
    if (logicalIndex < 0 || !theModel || !theModel->columnCount(rootIndex))
        return nullptr;

    auto id = childToId.constFind(logicalIndex);
    if (id != childToId.constEnd())
        return QAccessible::accessibleInterface(id.value());

    QAccessibleInterface *iface = nullptr;
    int index = logicalIndex;

    if (horizontalHeader()) {
        if (index < theModel->columnCount(rootIndex))
            iface = new QAccessibleTableHeaderCell(theView, index, Qt::Horizontal);
        else
            index -= theModel->columnCount(rootIndex);
    }

    if (!iface) {
        const int row = index / theModel->columnCount(rootIndex);
        const int column = index % theModel->columnCount(rootIndex);
        const QModelIndex modelIndex = indexFromLogical(row, column);
        if (!modelIndex.isValid())
            return nullptr;
        iface = new QAccessibleTableCell(theView, modelIndex, cellRole());
    }
    QAccessible::registerAccessibleInterface(iface);
    childToId.insert(logicalIndex, QAccessible::uniqueId(iface));
    return iface;
}